

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

QModelIndex * __thiscall QCompletionModel::currentIndex(QCompletionModel *this,bool sourceIndex)

{
  int iVar1;
  byte in_DL;
  long *in_RSI;
  QIndexMapper *in_RDI;
  long in_FS_OFFSET;
  int row;
  QModelIndex idx;
  QCompletionEngine *in_stack_ffffffffffffffb0;
  QIndexMapper *this_00;
  undefined1 *local_20;
  Data *local_18;
  QAbstractItemModel *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>::operator->
            ((QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_> *)
             (in_RSI + 3));
  iVar1 = QCompletionEngine::matchCount(in_stack_ffffffffffffffb0);
  if (iVar1 == 0) {
    QModelIndex::QModelIndex((QModelIndex *)0xa697c7);
  }
  else {
    QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>::operator->
              ((QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_> *)
               (in_RSI + 3));
    if ((*(byte *)(in_RSI + 4) & 1) != 0) {
      in_stack_ffffffffffffffb0 =
           QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>::operator->
                     ((QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>
                       *)(in_RSI + 3));
      in_stack_ffffffffffffffb0 = (QCompletionEngine *)&in_stack_ffffffffffffffb0->curMatch;
      QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>::operator->
                ((QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_> *)
                 (in_RSI + 3));
      QIndexMapper::operator[](this_00,(int)((ulong)in_RDI >> 0x20));
    }
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemModel::createIndex
              ((QAbstractItemModel *)this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
               in_stack_ffffffffffffffb0);
    if ((in_DL & 1) == 0) {
      *(undefined1 **)in_RDI = local_20;
      (in_RDI->vector).d.d = local_18;
      ((totally_ordered_wrapper<const_QAbstractItemModel_*> *)&(in_RDI->vector).d.ptr)->ptr =
           local_10;
    }
    else {
      (**(code **)(*in_RSI + 400))(in_RDI,in_RSI,&local_20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QModelIndex *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QCompletionModel::currentIndex(bool sourceIndex) const
{
    if (!engine->matchCount())
        return QModelIndex();

    int row = engine->curRow;
    if (showAll)
        row = engine->curMatch.indices[engine->curRow];

    QModelIndex idx = createIndex(row, c->column);
    if (!sourceIndex)
        return idx;
    return mapToSource(idx);
}